

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O2

void av1_convolve_2d_scale_sse4_1
               (uint8_t *src,int src_stride,uint8_t *dst8,int dst8_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  ushort uVar4;
  int16_t *piVar5;
  CONV_BUF_TYPE *pCVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint8_t *puVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  uint8_t *puVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  undefined2 *puVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  long lVar29;
  int iVar30;
  uint8_t uVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar35 [16];
  short sVar36;
  short sVar38;
  undefined1 in_XMM4 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar39 [16];
  short sVar40;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 in_XMM6 [16];
  undefined1 auVar41 [16];
  short sVar51;
  short sVar52;
  short sVar53;
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  CONV_BUF_TYPE *pCStack_10cb8;
  uint8_t *puStack_10cb0;
  undefined2 auStack_10c38 [34308];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  iVar20 = conv_params->round_0;
  bVar9 = (byte)iVar20;
  iVar30 = 1 << (bVar9 & 0x1f);
  uVar3 = filter_params_y->taps;
  iVar7 = iVar30 / 2 + 0x4000;
  iVar13 = (h + -1) * y_step_qn + subpel_y_qn >> 10;
  iVar1 = iVar13 + (uint)uVar3;
  iVar19 = ((uVar3 >> 1) - 1) * src_stride;
  uVar28 = 0;
  if (0 < w) {
    uVar28 = (ulong)(uint)w;
  }
  auVar33 = ZEXT416((uint)conv_params->round_0);
  lVar25 = (long)src_stride;
  lVar8 = (long)iVar1;
  puVar26 = auStack_10c38;
  for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
    uVar22 = (uint)subpel_x_qn >> 6 & 0xf;
    piVar5 = filter_params_x->filter_ptr;
    uVar4 = filter_params_x->taps;
    auVar34 = *(undefined1 (*) [16])(piVar5 + uVar22 * uVar4);
    puVar15 = src + ((long)(subpel_x_qn >> 10) - (long)iVar19);
    puVar21 = src + (long)(subpel_x_qn >> 10) + (-3 - (long)iVar19);
    for (lVar29 = 0; lVar29 <= (int)(iVar13 + (uint)uVar3 + -4); lVar29 = lVar29 + 4) {
      auVar35 = pmovzxbw(in_XMM3,*(undefined8 *)(puVar15 + -3));
      auVar37 = pmovzxbw(in_XMM4,*(undefined8 *)(puVar15 + lVar25 + -3));
      auVar39 = pmovzxbw(in_XMM5,*(undefined8 *)(puVar15 + (long)(src_stride * 2) + -3));
      auVar41 = pmovzxbw(in_XMM6,*(undefined8 *)(puVar15 + (long)(src_stride * 3) + -3));
      auVar35 = pmaddwd(auVar35,auVar34);
      in_XMM4 = pmaddwd(auVar37,auVar34);
      auVar35 = phaddd(auVar35,in_XMM4);
      auVar37 = pmaddwd(auVar39,auVar34);
      in_XMM6 = pmaddwd(auVar41,auVar34);
      in_XMM5 = phaddd(auVar37,in_XMM6);
      auVar35 = phaddd(auVar35,in_XMM5);
      auVar37._0_4_ = auVar35._0_4_ + iVar7 >> auVar33;
      auVar37._4_4_ = auVar35._4_4_ + iVar7 >> auVar33;
      auVar37._8_4_ = auVar35._8_4_ + iVar7 >> auVar33;
      auVar37._12_4_ = auVar35._12_4_ + iVar7 >> auVar33;
      in_XMM3 = packusdw(auVar37,auVar37);
      *(long *)(puVar26 + lVar29) = in_XMM3._0_8_;
      puVar15 = puVar15 + lVar25 * 4;
      puVar21 = puVar21 + lVar25 * 4;
    }
    for (; lVar29 < lVar8; lVar29 = lVar29 + 1) {
      iVar32 = 0x4000;
      for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
        iVar32 = iVar32 + (uint)puVar21[lVar16] *
                          (int)*(short *)((long)piVar5 +
                                         lVar16 * 2 +
                                         (ulong)((uint)uVar4 + (uint)uVar4) * (ulong)uVar22);
      }
      auStack_10c38[uVar17 * lVar8 + lVar29] = (short)(iVar32 + (iVar30 >> 1) >> (bVar9 & 0x1f));
      puVar21 = puVar21 + lVar25;
    }
    subpel_x_qn = subpel_x_qn + x_step_qn;
    puVar26 = puVar26 + lVar8;
  }
  bVar9 = 0x16 - bVar9;
  bVar12 = (byte)conv_params->round_1;
  bVar10 = bVar9 - bVar12;
  auVar33 = ZEXT416((uint)conv_params->round_1);
  pCVar6 = conv_params->dst;
  iVar7 = conv_params->dst_stride;
  uVar22 = 0xe - (iVar20 + conv_params->round_1);
  bVar11 = (byte)uVar22;
  iVar13 = (1 << (bVar11 & 0x1f)) >> 1;
  iVar19 = 1 << (bVar9 & 0x1f);
  auVar34._0_4_ = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  auVar34._4_4_ = auVar34._0_4_;
  auVar34._8_4_ = auVar34._0_4_;
  auVar34._12_4_ = auVar34._0_4_;
  iVar20 = ((1 << (bVar12 & 0x1f)) >> 1) + iVar19;
  uVar23 = iVar13 - ((1 << (bVar10 - 1 & 0x1f)) + (1 << (bVar10 & 0x1f)));
  auVar35 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
  uVar28 = (ulong)(uint)h;
  if (h < 1) {
    uVar28 = 0;
  }
  pCStack_10cb8 = pCVar6;
  puStack_10cb0 = dst8;
  for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
    uVar14 = (uint)subpel_y_qn >> 6 & 0xf;
    pauVar27 = (undefined1 (*) [16])(auStack_10c38 + (subpel_y_qn >> 10));
    piVar5 = filter_params_y->filter_ptr;
    uVar3 = filter_params_y->taps;
    auVar37 = *(undefined1 (*) [16])(piVar5 + uVar14 * uVar3);
    lVar16 = uVar17 * (long)dst8_stride;
    lVar25 = uVar17 * (long)iVar7;
    for (lVar29 = 0; lVar29 <= w + -4; lVar29 = lVar29 + 4) {
      auVar39 = pmaddwd(*pauVar27,auVar37);
      auVar41 = pmaddwd(*(undefined1 (*) [16])(*pauVar27 + lVar8 * 2),auVar37);
      auVar39 = phaddd(auVar39,auVar41);
      auVar41 = pmaddwd(*(undefined1 (*) [16])(*pauVar27 + (long)(iVar1 * 2) * 2),auVar37);
      auVar54 = pmaddwd(*(undefined1 (*) [16])(*pauVar27 + (long)(iVar1 * 3) * 2),auVar37);
      auVar41 = phaddd(auVar41,auVar54);
      auVar39 = phaddd(auVar39,auVar41);
      auVar41._0_4_ = auVar39._0_4_ + iVar20 >> auVar33;
      auVar41._4_4_ = auVar39._4_4_ + iVar20 >> auVar33;
      auVar41._8_4_ = auVar39._8_4_ + iVar20 >> auVar33;
      auVar41._12_4_ = auVar39._12_4_ + iVar20 >> auVar33;
      auVar39 = packusdw(auVar41,auVar41);
      sVar40 = auVar39._0_2_;
      sVar36 = auVar35._0_2_;
      sVar38 = auVar35._2_2_;
      sVar42 = auVar39._2_2_;
      sVar43 = auVar39._4_2_;
      sVar44 = auVar39._6_2_;
      if (conv_params->is_compound == 0) {
        auVar54._0_2_ = sVar40 + sVar36;
        auVar54._2_2_ = sVar42 + sVar38;
        auVar54._4_2_ = sVar43 + sVar36;
        auVar54._6_2_ = sVar44 + sVar38;
        auVar54._8_2_ = auVar39._8_2_ + sVar36;
        auVar54._10_2_ = auVar39._10_2_ + sVar38;
        auVar54._12_2_ = auVar39._12_2_ + sVar36;
        auVar54._14_2_ = auVar39._14_2_ + sVar38;
        auVar39 = psraw(auVar54,ZEXT416(uVar22));
        sVar36 = auVar39._0_2_;
        sVar38 = auVar39._2_2_;
        sVar40 = auVar39._4_2_;
        sVar42 = auVar39._6_2_;
        *(uint *)(puStack_10cb0 + lVar29) =
             CONCAT13((0 < sVar42) * (sVar42 < 0x100) * auVar39[6] - (0xff < sVar42),
                      CONCAT12((0 < sVar40) * (sVar40 < 0x100) * auVar39[4] - (0xff < sVar40),
                               CONCAT11((0 < sVar38) * (sVar38 < 0x100) * auVar39[2] -
                                        (0xff < sVar38),
                                        (0 < sVar36) * (sVar36 < 0x100) * auVar39[0] -
                                        (0xff < sVar36))));
      }
      else if (conv_params->do_average == 0) {
        *(long *)(pCStack_10cb8 + lVar29) = auVar39._0_8_;
      }
      else {
        uVar2 = *(ulong *)(pCStack_10cb8 + lVar29);
        sVar53 = (short)(uVar2 >> 0x30);
        sVar52 = (short)(uVar2 >> 0x20);
        auVar45._0_2_ = (short)uVar2;
        sVar51 = (short)(uVar2 >> 0x10);
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          auVar39._0_2_ = sVar40 + auVar45._0_2_;
          auVar39._2_2_ = sVar42 + sVar51;
          auVar39._4_2_ = sVar43 + sVar52;
          auVar39._6_2_ = sVar44 + sVar53;
          auVar39 = psraw(auVar39,1);
        }
        else {
          auVar48._8_4_ = 0;
          auVar48._0_8_ = uVar2;
          auVar48._12_2_ = sVar53;
          auVar48._14_2_ = sVar44;
          auVar47._12_4_ = auVar48._12_4_;
          auVar47._8_2_ = 0;
          auVar47._0_8_ = uVar2;
          auVar47._10_2_ = sVar43;
          auVar46._10_6_ = auVar47._10_6_;
          auVar46._8_2_ = sVar52;
          auVar46._0_8_ = uVar2;
          auVar45._8_8_ = auVar46._8_8_;
          auVar45._6_2_ = sVar42;
          auVar45._4_2_ = sVar51;
          auVar45._2_2_ = sVar40;
          auVar39 = pmaddwd(auVar45,auVar34);
          auVar49._0_4_ = auVar39._0_4_ >> 4;
          auVar49._4_4_ = auVar39._4_4_ >> 4;
          auVar49._8_4_ = auVar39._8_4_ >> 4;
          auVar49._12_4_ = auVar39._12_4_ >> 4;
          auVar39 = packusdw(auVar49,auVar49);
        }
        auVar50._0_2_ = auVar39._0_2_ + sVar36;
        auVar50._2_2_ = auVar39._2_2_ + sVar38;
        auVar50._4_2_ = auVar39._4_2_ + sVar36;
        auVar50._6_2_ = auVar39._6_2_ + sVar38;
        auVar50._8_2_ = auVar39._8_2_ + sVar36;
        auVar50._10_2_ = auVar39._10_2_ + sVar38;
        auVar50._12_2_ = auVar39._12_2_ + sVar36;
        auVar50._14_2_ = auVar39._14_2_ + sVar38;
        auVar39 = psraw(auVar50,ZEXT416(uVar22));
        sVar36 = auVar39._0_2_;
        sVar38 = auVar39._2_2_;
        sVar40 = auVar39._4_2_;
        sVar42 = auVar39._6_2_;
        *(uint *)(puStack_10cb0 + lVar29) =
             CONCAT13((0 < sVar42) * (sVar42 < 0x100) * auVar39[6] - (0xff < sVar42),
                      CONCAT12((0 < sVar40) * (sVar40 < 0x100) * auVar39[4] - (0xff < sVar40),
                               CONCAT11((0 < sVar38) * (sVar38 < 0x100) * auVar39[2] -
                                        (0xff < sVar38),
                                        (0 < sVar36) * (sVar36 < 0x100) * auVar39[0] -
                                        (0xff < sVar36))));
      }
      pauVar27 = (undefined1 (*) [16])(*pauVar27 + lVar8 * 8);
    }
    for (; lVar29 < w; lVar29 = lVar29 + 1) {
      iVar30 = iVar19;
      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
        iVar30 = iVar30 + (int)*(short *)(*pauVar27 + lVar18 * 2) *
                          (int)*(short *)((long)piVar5 +
                                         lVar18 * 2 +
                                         (ulong)((uint)uVar3 + (uint)uVar3) * (ulong)uVar14);
      }
      bVar12 = (byte)conv_params->round_1;
      uVar24 = ((1 << (bVar12 & 0x1f)) >> 1) + iVar30 >> (bVar12 & 0x1f);
      if (conv_params->is_compound == 0) {
        iVar30 = (int)((-1 << (bVar9 - bVar12 & 0x1f)) + iVar13 +
                       (-1 << ((bVar9 - bVar12) - 1 & 0x1f)) + (uVar24 & 0xffff)) >> (bVar11 & 0x1f)
        ;
        if (iVar30 < 1) {
          iVar30 = 0;
        }
        uVar31 = (uint8_t)iVar30;
        if (0xfe < iVar30) {
          uVar31 = 0xff;
        }
        dst8[lVar29 + lVar16] = uVar31;
      }
      else if (conv_params->do_average == 0) {
        pCVar6[lVar25 + lVar29] = (CONV_BUF_TYPE)uVar24;
      }
      else {
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          uVar24 = (uVar24 & 0xffff) + (uint)pCVar6[lVar25 + lVar29] >> 1;
        }
        else {
          uVar24 = (int)((uVar24 & 0xffff) * conv_params->bck_offset +
                        (uint)pCVar6[lVar25 + lVar29] * conv_params->fwd_offset) >> 4;
        }
        iVar30 = (int)(uVar24 + uVar23) >> (bVar11 & 0x1f);
        if (iVar30 < 1) {
          iVar30 = 0;
        }
        uVar31 = (uint8_t)iVar30;
        if (0xfe < iVar30) {
          uVar31 = 0xff;
        }
        dst8[lVar29 + lVar16] = uVar31;
      }
      pauVar27 = (undefined1 (*) [16])(*pauVar27 + lVar8 * 2);
    }
    subpel_y_qn = subpel_y_qn + y_step_qn;
    pCStack_10cb8 = pCStack_10cb8 + iVar7;
    puStack_10cb0 = puStack_10cb0 + dst8_stride;
  }
  return;
}

Assistant:

void av1_convolve_2d_scale_sse4_1(const uint8_t *src, int src_stride,
                                  uint8_t *dst8, int dst8_stride, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_x_qn, const int x_step_qn,
                                  const int subpel_y_qn, const int y_step_qn,
                                  ConvolveParams *conv_params) {
  int16_t tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;

  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h, subpel_x_qn,
           x_step_qn, filter_params_x, conv_params->round_0);

  // vertical filter (input is transposed)
  vfilter8(tmp, im_h, dst8, dst8_stride, w, h, subpel_y_qn, y_step_qn,
           filter_params_y, conv_params, 8);
}